

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall icu_63::TailoredSet::addContractions(TailoredSet *this,UChar32 c,UChar *p)

{
  UBool UVar1;
  UnicodeString *sfx;
  ConstChar16Ptr local_a0;
  undefined1 local_98 [8];
  Iterator suffixes;
  UChar *p_local;
  UChar32 c_local;
  TailoredSet *this_local;
  
  suffixes.stack_ = (UVector32 *)p;
  ConstChar16Ptr::ConstChar16Ptr(&local_a0,p);
  UCharsTrie::Iterator::Iterator((Iterator *)local_98,&local_a0,0,&this->errorCode);
  ConstChar16Ptr::~ConstChar16Ptr(&local_a0);
  while( true ) {
    UVar1 = UCharsTrie::Iterator::next((Iterator *)local_98,&this->errorCode);
    if (UVar1 == '\0') break;
    sfx = UCharsTrie::Iterator::getString((Iterator *)local_98);
    addSuffix(this,c,sfx);
  }
  UCharsTrie::Iterator::~Iterator((Iterator *)local_98);
  return;
}

Assistant:

void
TailoredSet::addContractions(UChar32 c, const UChar *p) {
    UCharsTrie::Iterator suffixes(p, 0, errorCode);
    while(suffixes.next(errorCode)) {
        addSuffix(c, suffixes.getString());
    }
}